

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *in_RDI;
  AssertionResult gtest_ar;
  Type in_stack_0000012c;
  TestPartResultArray *in_stack_00000130;
  char *in_stack_00000138;
  char *in_stack_00000140;
  char *in_stack_00000148;
  string *in_stack_00000160;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  Type in_stack_ffffffffffffffec;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffff0;
  
  HasOneFailure(in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130,
                in_stack_0000012c,in_stack_00000160);
  bVar1 = AssertionResult::operator_cast_to_bool((AssertionResult *)&stack0xffffffffffffffe8);
  if (!bVar1) {
    Message::Message((Message *)in_stack_fffffffffffffff0.ptr_);
    this_00 = (AssertHelper *)AssertionResult::failure_message((AssertionResult *)0x14f937);
    AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffff0.ptr_,in_stack_ffffffffffffffec,
               in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_RDI);
    AssertHelper::operator=((AssertHelper *)this,(Message *)gtest_ar.message_.ptr_);
    AssertHelper::~AssertHelper(this_00);
    Message::~Message((Message *)0x14f985);
  }
  AssertionResult::~AssertionResult((AssertionResult *)0x14f98f);
  std::__cxx11::string::~string((string *)(in_RDI + 0x10));
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}